

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * handle_attributes(dmr_C *C,token *token,decl_state *ctx,uint keywords)

{
  symbol *psVar1;
  symbol *keyword;
  uint keywords_local;
  decl_state *ctx_local;
  token *token_local;
  dmr_C *C_local;
  
  ctx_local = (decl_state *)token;
  for (keyword._4_4_ = keywords;
      (((((uint)(ctx_local->ctype).modifiers & 0x3f) == 2 &&
        (psVar1 = dmrC_lookup_keyword((ident *)(ctx_local->ctype).contexts,NS_KEYWORD|NS_TYPEDEF),
        psVar1 != (symbol *)0x0)) &&
       (((undefined1  [232])*psVar1 & (undefined1  [232])0xff) == (undefined1  [232])0x11)) &&
      ((psVar1->op->type & keyword._4_4_) != 0)); keyword._4_4_ = keyword._4_4_ & KW_ATTRIBUTE) {
    ctx_local = (decl_state *)(*psVar1->op->declarator)(C,(token *)(ctx_local->ctype).alignment,ctx)
    ;
  }
  return (token *)ctx_local;
}

Assistant:

static struct token *handle_attributes(struct dmr_C *C, struct token *token, struct decl_state *ctx, unsigned int keywords)
{
	struct symbol *keyword;
	for (;;) {
		if (dmrC_token_type(token) != TOKEN_IDENT)
			break;
		keyword = dmrC_lookup_keyword(token->ident, NS_KEYWORD | NS_TYPEDEF);
		if (!keyword || keyword->type != SYM_KEYWORD)
			break;
		if (!(keyword->op->type & keywords))
			break;
		token = keyword->op->declarator(C, token->next, ctx);
		keywords &= KW_ATTRIBUTE;
	}
	return token;
}